

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O2

size_t HUF_readStats_wksp(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                         U32 *tableLogPtr,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                         int flags)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  U32 UVar6;
  byte *pbVar7;
  
  sVar3 = 0xffffffffffffffb8;
  if (srcSize != 0) {
    uVar4 = (ulong)*src;
    if ((char)*src < '\0') {
      uVar5 = uVar4 - 0x7e >> 1;
      if (srcSize <= uVar5) {
        return 0xffffffffffffffb8;
      }
      sVar3 = uVar4 - 0x7f;
      if (hwSize <= sVar3) {
        return 0xffffffffffffffec;
      }
      pbVar7 = (byte *)((long)src + 1);
      for (uVar4 = 0; uVar4 < sVar3; uVar4 = uVar4 + 2) {
        huffWeight[uVar4] = *pbVar7 >> 4;
        huffWeight[uVar4 + 1] = *pbVar7 & 0xf;
        pbVar7 = pbVar7 + 1;
      }
    }
    else {
      if (srcSize <= uVar4) {
        return 0xffffffffffffffb8;
      }
      sVar3 = FSE_decompress_wksp_bmi2
                        (huffWeight,hwSize - 1,(void *)((long)src + 1),uVar4,6,workSpace,wkspSize,0)
      ;
      uVar5 = uVar4;
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
    }
    rankStats[8] = 0;
    rankStats[9] = 0;
    rankStats[10] = 0;
    rankStats[0xb] = 0;
    rankStats[4] = 0;
    rankStats[5] = 0;
    rankStats[6] = 0;
    rankStats[7] = 0;
    rankStats[0xc] = 0;
    rankStats[0] = 0;
    rankStats[1] = 0;
    rankStats[2] = 0;
    rankStats[3] = 0;
    UVar6 = 0;
    for (uVar1 = 0; uVar4 = (ulong)uVar1, uVar4 < sVar3; uVar1 = uVar1 + 1) {
      if (0xc < (ulong)huffWeight[uVar4]) goto LAB_001f52fd;
      rankStats[huffWeight[uVar4]] = rankStats[huffWeight[uVar4]] + 1;
      UVar6 = UVar6 + ((1 << (huffWeight[uVar4] & 0x1f)) >> 1);
    }
    if ((UVar6 != 0) && (uVar1 = ZSTD_highbit32(UVar6), uVar1 < 0xc)) {
      *tableLogPtr = uVar1 + 1;
      UVar6 = (2 << ((byte)uVar1 & 0x1f)) - UVar6;
      uVar1 = ZSTD_highbit32(UVar6);
      uVar2 = ZSTD_highbit32(UVar6);
      if (1 << ((byte)uVar1 & 0x1f) == UVar6) {
        huffWeight[sVar3] = (char)uVar2 + '\x01';
        rankStats[(ulong)uVar2 + 1] = rankStats[(ulong)uVar2 + 1] + 1;
        if ((rankStats[1] & 1) != 0 || rankStats[1] < 2) {
          return 0xffffffffffffffec;
        }
        *nbSymbolsPtr = (int)sVar3 + 1;
        return uVar5 + 1;
      }
    }
LAB_001f52fd:
    sVar3 = 0xffffffffffffffec;
  }
  return sVar3;
}

Assistant:

size_t HUF_readStats_wksp(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize,
                     void* workSpace, size_t wkspSize,
                     int flags)
{
#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        return HUF_readStats_body_bmi2(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
    }
#endif
    (void)flags;
    return HUF_readStats_body_default(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
}